

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_operate.c
# Opt level: O3

void single_transfer_cleanup(OperationConfig *config)

{
  if (config != (OperationConfig *)0x0) {
    glob_cleanup(&(config->state).urls);
    free((config->state).outfiles);
    (config->state).outfiles = (char *)0x0;
    free((config->state).uploadfile);
    (config->state).uploadfile = (char *)0x0;
    glob_cleanup(&(config->state).inglob);
    return;
  }
  return;
}

Assistant:

void single_transfer_cleanup(struct OperationConfig *config)
{
  if(config) {
    struct State *state = &config->state;
    /* Free list of remaining URLs */
    glob_cleanup(&state->urls);
    curlx_safefree(state->outfiles);
    curlx_safefree(state->uploadfile);
    /* Free list of globbed upload files */
    glob_cleanup(&state->inglob);
  }
}